

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

uint32_t write_tiles_in_tg_obus
                   (AV1_COMP *cpi,uint8_t *dst,size_t dst_size,aom_write_bit_buffer *saved_wb,
                   uint8_t obu_extension_header,FrameHeaderInfo *fh_info,int *largest_tile_id)

{
  long in_RDI;
  CommonTileParams *tiles;
  AV1_COMMON *cm;
  undefined7 in_stack_00000018;
  uint32_t local_4;
  
  *(undefined4 *)CONCAT17(cm._7_1_,cm._0_7_) = 0;
  if ((*(char *)(in_RDI + 0x409b8) != '\0') && (*(char *)(in_RDI + 0x409b9) != '\0')) {
    if (*(int *)(in_RDI + 0x3c17c) == 7) {
      *(undefined1 *)(in_RDI + 0x409bb) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x409bb) = 1;
      if (*(ulong *)(in_RDI + 0x3ac78) < *(ulong *)(in_RDI + 0x3ac80)) {
        *(undefined1 *)(in_RDI + 0x409bb) = 0;
      }
    }
  }
  if (*(int *)(in_RDI + 0x42264) == 0) {
    local_4 = pack_tiles_in_tg_obus
                        ((AV1_COMP *)dst,(uint8_t *)dst_size,saved_wb,obu_extension_header,fh_info,
                         (int *)CONCAT17(cm._7_1_,cm._0_7_));
  }
  else {
    local_4 = pack_large_scale_tiles_in_tg_obus
                        ((AV1_COMP *)saved_wb,
                         (uint8_t *)CONCAT17(obu_extension_header,in_stack_00000018),
                         (aom_write_bit_buffer *)fh_info,cm._7_1_,&tiles->cols);
  }
  return local_4;
}

Assistant:

static uint32_t write_tiles_in_tg_obus(AV1_COMP *const cpi, uint8_t *const dst,
                                       size_t dst_size,
                                       struct aom_write_bit_buffer *saved_wb,
                                       uint8_t obu_extension_header,
                                       const FrameHeaderInfo *fh_info,
                                       int *const largest_tile_id) {
  // TODO: bug 42302568 - Use dst_size.
  (void)dst_size;
  AV1_COMMON *const cm = &cpi->common;
  const CommonTileParams *const tiles = &cm->tiles;
  *largest_tile_id = 0;

  // Select the coding strategy (temporal or spatial)
  if (cm->seg.enabled && cm->seg.update_map) {
    if (cm->features.primary_ref_frame == PRIMARY_REF_NONE) {
      cm->seg.temporal_update = 0;
    } else {
      cm->seg.temporal_update = 1;
      if (cpi->td.rd_counts.seg_tmp_pred_cost[0] <
          cpi->td.rd_counts.seg_tmp_pred_cost[1])
        cm->seg.temporal_update = 0;
    }
  }

  if (tiles->large_scale)
    return pack_large_scale_tiles_in_tg_obus(
        cpi, dst, saved_wb, obu_extension_header, largest_tile_id);

  return pack_tiles_in_tg_obus(cpi, dst, saved_wb, obu_extension_header,
                               fh_info, largest_tile_id);
}